

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

void memory_listener_register_mips64(MemoryListener *listener,AddressSpace *as)

{
  uc_struct_conflict12 *puVar1;
  QTailQLink *pQVar2;
  FlatView *pFVar3;
  uint uVar4;
  FlatRange *pFVar5;
  FlatRange *pFVar6;
  MemoryRegionSection local_68;
  
  listener->address_space = as;
  (listener->link).tqe_next = (MemoryListener *)0x0;
  (listener->link).tqe_circ.tql_prev = (as->uc->memory_listeners).tqh_circ.tql_prev;
  puVar1 = as->uc;
  ((puVar1->memory_listeners).tqh_circ.tql_prev)->tql_next = listener;
  (puVar1->memory_listeners).tqh_circ.tql_prev = (QTailQLink *)&listener->link;
  (listener->link_as).tqe_next = (MemoryListener *)0x0;
  pQVar2 = (as->listeners).tqh_circ.tql_prev;
  (listener->link_as).tqe_circ.tql_prev = pQVar2;
  pQVar2->tql_next = listener;
  (as->listeners).tqh_circ.tql_prev = (QTailQLink *)&listener->link_as;
  if (listener->begin != (_func_void_MemoryListener_ptr *)0x0) {
    (*listener->begin)(listener);
  }
  pFVar3 = as->current_map;
  uVar4 = pFVar3->nr;
  if (uVar4 != 0) {
    pFVar5 = pFVar3->ranges;
    pFVar6 = pFVar5;
    do {
      local_68.size._0_4_ = (undefined4)(pFVar6->addr).size;
      local_68.size._4_4_ = *(undefined4 *)((long)&(pFVar6->addr).size + 4);
      local_68.size._8_4_ = *(undefined4 *)((long)&(pFVar6->addr).size + 8);
      local_68.size._12_4_ = *(undefined4 *)((long)&(pFVar6->addr).size + 0xc);
      local_68.mr = pFVar6->mr;
      local_68.offset_within_region = pFVar6->offset_in_region;
      local_68.fv = pFVar3;
      if (*(long *)((long)&(pFVar6->addr).start + 8) != 0) {
        __assert_fail("r == a",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                      ,0x16,"uint64_t int128_get64(Int128)");
      }
      local_68.offset_within_address_space = (hwaddr)(pFVar6->addr).start;
      local_68.readonly = pFVar6->readonly;
      if (listener->region_add != (_func_void_MemoryListener_ptr_MemoryRegionSection_ptr *)0x0) {
        (*listener->region_add)(listener,&local_68);
        pFVar5 = pFVar3->ranges;
        uVar4 = pFVar3->nr;
      }
      pFVar6 = pFVar6 + 1;
    } while (pFVar6 < pFVar5 + uVar4);
  }
  if (listener->commit != (_func_void_MemoryListener_ptr *)0x0) {
    (*listener->commit)(listener);
  }
  return;
}

Assistant:

void memory_listener_register(MemoryListener *listener, AddressSpace *as)
{
    listener->address_space = as;
    QTAILQ_INSERT_TAIL(&as->uc->memory_listeners, listener, link);
    QTAILQ_INSERT_TAIL(&as->listeners, listener, link_as);

    listener_add_address_space(listener, as);
}